

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bessel.c
# Opt level: O1

double xc_bessel_I0(double x)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar2 = ABS(x);
  if (2.9802322387695312e-08 <= dVar2) {
    if (dVar2 <= 3.0) {
      dVar5 = (x * x) / 4.5 + -1.0;
      uVar1 = 0xd;
      dVar2 = 0.0;
      dVar3 = 0.0;
      do {
        dVar4 = dVar3;
        dVar3 = dVar2;
        dVar2 = ((dVar5 + dVar5) * dVar3 - dVar4) + (double)(&DAT_010ad860)[uVar1];
        uVar1 = uVar1 - 1;
      } while (1 < uVar1);
      dVar2 = (dVar2 - dVar4) * 0.5 + 2.75;
    }
    else if (708.782712893384 <= dVar2) {
      xc_bessel_I0_cold_1();
      dVar2 = 0.0;
    }
    else {
      dVar3 = exp(dVar2);
      dVar2 = xc_bessel_I0_scaled(x);
      dVar2 = dVar2 * dVar3;
    }
  }
  else {
    dVar2 = 1.0;
  }
  return dVar2;
}

Assistant:

GPU_FUNCTION
double xc_bessel_I0(const double x)
{
  double y = fabs(x), r = 0.0;

  if(y < 2.0*SQRT_DBL_EPSILON)
    r = 1.0;
  else if(y <= 3.0)
    r = 2.75 + xc_cheb_eval(y*y/4.5 - 1.0, bi0_data, 12);
  else if(y < LOG_DBL_MAX - 1.0)
    r = exp(y) * xc_bessel_I0_scaled(x);
  else {
#ifndef HAVE_CUDA
    fprintf(stderr, "Overflow in bessel_I0\n");
#endif
  }

  return r;
}